

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::DataPageHeaderV2::write(DataPageHeaderV2 *this,int __fd,void *__buf,size_t __n)

{
  _DataPageHeaderV2__isset _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ssize_t sVar21;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar2 = (*this_00->_vptr_TProtocol[4])(this_00,"DataPageHeaderV2");
  iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"num_values",8,1);
  iVar4 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)(uint)this->num_values);
  iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar6 = (*this_00->_vptr_TProtocol[6])(this_00,"num_nulls",8,2);
  iVar7 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)(uint)this->num_nulls);
  iVar8 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar9 = (*this_00->_vptr_TProtocol[6])(this_00,"num_rows",8,3);
  iVar10 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)(uint)this->num_rows);
  iVar11 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar12 = (*this_00->_vptr_TProtocol[6])(this_00,"encoding",8,4);
  iVar13 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)this->encoding);
  iVar14 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar15 = (*this_00->_vptr_TProtocol[6])(this_00,"definition_levels_byte_length",8,5);
  iVar16 = (*this_00->_vptr_TProtocol[0x12])
                     (this_00,(ulong)(uint)this->definition_levels_byte_length);
  iVar17 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar18 = (*this_00->_vptr_TProtocol[6])(this_00,"repetition_levels_byte_length",8,6);
  iVar19 = (*this_00->_vptr_TProtocol[0x12])
                     (this_00,(ulong)(uint)this->repetition_levels_byte_length);
  iVar20 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar2 = iVar18 + iVar19 + iVar20 +
          iVar13 + iVar14 + iVar15 + iVar16 + iVar17 +
          iVar9 + iVar10 + iVar11 + iVar12 + iVar6 + iVar7 + iVar8 + iVar4 + iVar5 + iVar3 + iVar2;
  _Var1 = this->__isset;
  if (((byte)_Var1 & 1) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"is_compressed",2,7);
    iVar4 = (*this_00->_vptr_TProtocol[0xf])(this_00,(ulong)this->is_compressed);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 2) != 0) {
    __n_00 = 8;
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"statistics",0xc);
    sVar21 = Statistics::write(&this->statistics,__fd,__buf_00,__n_00);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = (int)sVar21 + iVar4 + iVar3 + iVar2;
  }
  iVar3 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar3 + iVar2 + iVar4);
}

Assistant:

uint32_t DataPageHeaderV2::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("DataPageHeaderV2");

  xfer += oprot->writeFieldBegin("num_values", ::apache::thrift::protocol::T_I32, 1);
  xfer += oprot->writeI32(this->num_values);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("num_nulls", ::apache::thrift::protocol::T_I32, 2);
  xfer += oprot->writeI32(this->num_nulls);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("num_rows", ::apache::thrift::protocol::T_I32, 3);
  xfer += oprot->writeI32(this->num_rows);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("encoding", ::apache::thrift::protocol::T_I32, 4);
  xfer += oprot->writeI32(static_cast<int32_t>(this->encoding));
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("definition_levels_byte_length", ::apache::thrift::protocol::T_I32, 5);
  xfer += oprot->writeI32(this->definition_levels_byte_length);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("repetition_levels_byte_length", ::apache::thrift::protocol::T_I32, 6);
  xfer += oprot->writeI32(this->repetition_levels_byte_length);
  xfer += oprot->writeFieldEnd();

  if (this->__isset.is_compressed) {
    xfer += oprot->writeFieldBegin("is_compressed", ::apache::thrift::protocol::T_BOOL, 7);
    xfer += oprot->writeBool(this->is_compressed);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.statistics) {
    xfer += oprot->writeFieldBegin("statistics", ::apache::thrift::protocol::T_STRUCT, 8);
    xfer += this->statistics.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}